

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_loop_filter_frame_init(AV1_COMMON *cm,int plane_start,int plane_end)

{
  uint8_t (*paauVar1) [8] [2];
  bool bVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint8_t uVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 auVar17 [16];
  int filt_lvl_r [3];
  int filt_lvl [3];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint8_t (*local_48) [8] [2] [8] [2];
  int16_t (*local_40) [8];
  SEG_LVL_FEATURES (*local_38) [2];
  
  update_sharpness(&cm->lf_info,(cm->lf).sharpness_level);
  local_54 = (cm->lf).filter_level[0];
  local_50 = (cm->lf).filter_level_u;
  local_4c = (cm->lf).filter_level_v;
  local_60 = (cm->lf).filter_level[1];
  local_5c = local_50;
  local_58 = local_4c;
  if (plane_start < plane_end) {
    local_40 = (cm->seg).feature_data;
    local_48 = (cm->lf_info).lvl;
    lVar10 = (long)plane_start;
    do {
      if ((lVar10 == 0 && local_54 == 0) && local_60 == 0) {
        return;
      }
      if ((lVar10 != 1 || local_50 != 0) && (lVar10 != 2 || local_4c != 0)) {
        local_38 = seg_lvl_lf_lut + lVar10;
        lVar4 = 0;
        do {
          lVar7 = 0;
          bVar3 = true;
          do {
            bVar2 = bVar3;
            piVar6 = &local_60;
            if (bVar2) {
              piVar6 = &local_54;
            }
            uVar9 = piVar6[lVar10];
            if (((cm->seg).enabled != '\0') &&
               (uVar8 = (uint)seg_lvl_lf_lut[lVar10][lVar7],
               ((cm->seg).feature_mask[lVar4] >> (uVar8 & 0x1f) & 1) != 0)) {
              uVar8 = uVar9 + (int)local_40[lVar4][uVar8];
              uVar9 = 0x3f;
              if (uVar8 < 0x3f) {
                uVar9 = uVar8;
              }
              if ((int)uVar8 < 0) {
                uVar9 = 0;
              }
            }
            if ((cm->lf).mode_ref_delta_enabled == '\0') {
              uVar20 = (undefined1)(uVar9 >> 0x18);
              uVar19 = (undefined1)(uVar9 >> 0x10);
              uVar18 = (undefined1)(uVar9 >> 8);
              auVar17._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar20,uVar20),uVar19),CONCAT14(uVar19,uVar9))
                        >> 0x20);
              auVar17[3] = uVar18;
              auVar17[2] = uVar18;
              auVar17[0] = (undefined1)uVar9;
              auVar17[1] = auVar17[0];
              auVar17._8_8_ = 0;
              auVar17 = pshuflw(auVar17,auVar17,0);
              uVar16 = auVar17._0_4_;
              paauVar1 = local_48[lVar10][lVar4] + lVar7;
              *(undefined4 *)*paauVar1 = uVar16;
              *(undefined4 *)(*paauVar1 + 2) = uVar16;
              *(undefined4 *)(*paauVar1 + 4) = uVar16;
              *(undefined4 *)(*paauVar1 + 6) = uVar16;
            }
            else {
              bVar5 = (byte)((int)uVar9 >> 5);
              uVar11 = ((int)(cm->lf).ref_deltas[0] << (bVar5 & 0x1f)) + uVar9;
              uVar8 = 0x3f;
              if (uVar11 < 0x3f) {
                uVar8 = uVar11;
              }
              uVar14 = (uint8_t)uVar8;
              if ((int)uVar11 < 0) {
                uVar14 = '\0';
              }
              local_48[lVar10][lVar4][lVar7][0][0] = uVar14;
              lVar12 = 1;
              do {
                lVar13 = 0;
                bVar3 = true;
                do {
                  bVar15 = bVar3;
                  uVar11 = ((int)(cm->lf).mode_deltas[lVar13] + (int)(cm->lf).ref_deltas[lVar12] <<
                           (bVar5 & 0x1f)) + uVar9;
                  uVar8 = 0x3f;
                  if (uVar11 < 0x3f) {
                    uVar8 = uVar11;
                  }
                  uVar14 = (uint8_t)uVar8;
                  if ((int)uVar11 < 0) {
                    uVar14 = '\0';
                  }
                  local_48[lVar10][lVar4][lVar7][lVar12][lVar13] = uVar14;
                  lVar13 = 1;
                  bVar3 = false;
                } while (bVar15);
                lVar12 = lVar12 + 1;
              } while (lVar12 != 8);
            }
            lVar7 = 1;
            bVar3 = false;
          } while (bVar2);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 8);
      }
      lVar10 = lVar10 + 1;
    } while ((int)lVar10 != plane_end);
  }
  return;
}

Assistant:

void av1_loop_filter_frame_init(AV1_COMMON *cm, int plane_start,
                                int plane_end) {
  int filt_lvl[MAX_MB_PLANE], filt_lvl_r[MAX_MB_PLANE];
  int plane;
  int seg_id;
  // n_shift is the multiplier for lf_deltas
  // the multiplier is 1 for when filter_lvl is between 0 and 31;
  // 2 when filter_lvl is between 32 and 63
  loop_filter_info_n *const lfi = &cm->lf_info;
  struct loopfilter *const lf = &cm->lf;
  const struct segmentation *const seg = &cm->seg;

  // update sharpness limits
  update_sharpness(lfi, lf->sharpness_level);

  filt_lvl[0] = cm->lf.filter_level[0];
  filt_lvl[1] = cm->lf.filter_level_u;
  filt_lvl[2] = cm->lf.filter_level_v;

  filt_lvl_r[0] = cm->lf.filter_level[1];
  filt_lvl_r[1] = cm->lf.filter_level_u;
  filt_lvl_r[2] = cm->lf.filter_level_v;

  assert(plane_start >= AOM_PLANE_Y);
  assert(plane_end <= MAX_MB_PLANE);

  for (plane = plane_start; plane < plane_end; plane++) {
    if (plane == 0 && !filt_lvl[0] && !filt_lvl_r[0])
      break;
    else if (plane == 1 && !filt_lvl[1])
      continue;
    else if (plane == 2 && !filt_lvl[2])
      continue;

    for (seg_id = 0; seg_id < MAX_SEGMENTS; seg_id++) {
      for (int dir = 0; dir < 2; ++dir) {
        int lvl_seg = (dir == 0) ? filt_lvl[plane] : filt_lvl_r[plane];
        const int seg_lf_feature_id = seg_lvl_lf_lut[plane][dir];
        if (segfeature_active(seg, seg_id, seg_lf_feature_id)) {
          const int data = get_segdata(&cm->seg, seg_id, seg_lf_feature_id);
          lvl_seg = clamp(lvl_seg + data, 0, MAX_LOOP_FILTER);
        }

        if (!lf->mode_ref_delta_enabled) {
          // we could get rid of this if we assume that deltas are set to
          // zero when not in use; encoder always uses deltas
          memset(lfi->lvl[plane][seg_id][dir], lvl_seg,
                 sizeof(lfi->lvl[plane][seg_id][dir]));
        } else {
          int ref, mode;
          const int scale = 1 << (lvl_seg >> 5);
          const int intra_lvl = lvl_seg + lf->ref_deltas[INTRA_FRAME] * scale;
          lfi->lvl[plane][seg_id][dir][INTRA_FRAME][0] =
              clamp(intra_lvl, 0, MAX_LOOP_FILTER);

          for (ref = LAST_FRAME; ref < REF_FRAMES; ++ref) {
            for (mode = 0; mode < MAX_MODE_LF_DELTAS; ++mode) {
              const int inter_lvl = lvl_seg + lf->ref_deltas[ref] * scale +
                                    lf->mode_deltas[mode] * scale;
              lfi->lvl[plane][seg_id][dir][ref][mode] =
                  clamp(inter_lvl, 0, MAX_LOOP_FILTER);
            }
          }
        }
      }
    }
  }
}